

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test2::prepareUniformVerification
          (GPUShaderFP64Test2 *this,shaderStage shader_stage,uniformTypeDetails *uniform_type,
          string *out_source_code)

{
  ostream *poVar1;
  string local_1f8 [32];
  uint local_1d8;
  GLuint element;
  stringstream local_1c8 [8];
  stringstream stream;
  ostream local_1b8;
  GLuint local_3c;
  uint local_38;
  GLuint n_uniforms;
  GLuint n_elements;
  GLuint n_rows;
  GLuint n_columns;
  GLuint element_ordinal;
  string *out_source_code_local;
  uniformTypeDetails *uniform_type_local;
  GPUShaderFP64Test2 *pGStack_10;
  shaderStage shader_stage_local;
  GPUShaderFP64Test2 *this_local;
  
  n_rows = 1;
  n_elements = uniform_type->m_n_columns;
  n_uniforms = uniform_type->m_n_rows;
  local_38 = n_elements * n_uniforms;
  _n_columns = out_source_code;
  out_source_code_local = (string *)uniform_type;
  uniform_type_local._4_4_ = shader_stage;
  pGStack_10 = this;
  local_3c = getAmountUniforms(this,shader_stage,uniform_type);
  std::__cxx11::stringstream::stringstream(local_1c8);
  poVar1 = std::operator<<(&local_1b8,"    int verification_result = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,1);
  poVar1 = std::operator<<(poVar1,";\n\n    for (int i = 0; i < ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_3c);
  poVar1 = std::operator<<(poVar1,"; ++i)\n    {\n        if (");
  poVar1 = std::operator<<(poVar1,(string *)(out_source_code_local->field_2)._M_local_buf);
  std::operator<<(poVar1,"(");
  for (local_1d8 = 0; local_1d8 < local_38; local_1d8 = local_1d8 + 1) {
    poVar1 = std::operator<<(&local_1b8,"i * (");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_38);
    poVar1 = std::operator<<(poVar1,") + ");
    std::ostream::operator<<(poVar1,local_1d8 + 1);
    if (local_38 != local_1d8 + 1) {
      std::operator<<(&local_1b8,", ");
    }
    n_rows = n_rows + 1;
  }
  poVar1 = std::operator<<(&local_1b8,
                           ") != uniform_array[i])\n        {\n           verification_result = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,2);
  std::operator<<(poVar1,";\n        }\n    }\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)_n_columns,local_1f8);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::stringstream::~stringstream(local_1c8);
  return;
}

Assistant:

void GPUShaderFP64Test2::prepareUniformVerification(shaderStage shader_stage, const uniformTypeDetails& uniform_type,
													std::string& out_source_code) const
{
	glw::GLuint		  element_ordinal = 1;
	const glw::GLuint n_columns		  = uniform_type.m_n_columns;
	const glw::GLuint n_rows		  = uniform_type.m_n_rows;
	const glw::GLuint n_elements	  = n_columns * n_rows;
	const glw::GLuint n_uniforms	  = getAmountUniforms(shader_stage, uniform_type);
	std::stringstream stream;

	/*
	 * int verification_result = M_RESULT_SUCCESS;
	 *
	 * for (int i = 0; i < N_UNIFORMS; ++i)
	 * {
	 *     if (TYPE_NAME(i * (N_ELEMENTS) + 1) != uniform_array[i])
	 *     {
	 *         verification_result = M_RESULT_FAILURE
	 *     }
	 * }
	 */
	stream << "    int verification_result = " << m_result_success << ";\n"
																	  "\n"
																	  "    for (int i = 0; i < "
		   << n_uniforms << "; ++i)\n"
							"    {\n"
							"        if ("
		   << uniform_type.m_type_name << "(";

	for (glw::GLuint element = 0; element < n_elements; ++element, ++element_ordinal)
	{
		stream << "i * (" << n_elements << ") + " << element + 1;

		if (n_elements != element + 1)
		{
			stream << ", ";
		}
	}

	stream << ") != uniform_array[i])\n"
			  "        {\n"
			  "           verification_result = "
		   << m_result_failure << ";\n"
								  "        }\n"
								  "    }\n";

	out_source_code = stream.str();
}